

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
insert_simplex_raw<std::vector<int,std::allocator<int>>>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,
          vector<int,_std::allocator<int>_> *simplex,Filtration_value *filtration)

{
  bool bVar1;
  Vertex_handle VVar2;
  int iVar3;
  pointer ppVar4;
  reference piVar5;
  uint *puVar6;
  type tVar7;
  undefined8 extraout_RDX;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  pVar8;
  undefined1 local_98 [4];
  int dim;
  undefined1 local_81;
  undefined8 *local_80;
  undefined1 local_78 [40];
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  const_iterator vi;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool>
  res_insert;
  Siblings *curr_sib;
  Filtration_value *filtration_local;
  vector<int,_std::allocator<int>_> *simplex_local;
  Simplex_tree<Gudhi::Simplex_tree_options_default> *this_local;
  
  res_insert._8_8_ =
       &simplex[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  std::
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool>
  ::
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool,_true>
            ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool>
              *)&vi);
  local_48._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)filtration);
  while( true ) {
    local_78._32_8_ =
         std::vector<int,_std::allocator<int>_>::end
                   ((vector<int,_std::allocator<int>_> *)filtration);
    local_50 = std::
               prev<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                         ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                          local_78._32_8_,1);
    bVar1 = __gnu_cxx::operator!=(&local_48,&local_50);
    if (!bVar1) {
      piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_48);
      iVar3 = *piVar5;
      VVar2 = null_vertex((Simplex_tree<Gudhi::Simplex_tree_options_default> *)simplex);
      local_81 = 0;
      if (iVar3 == VVar2) {
        local_80 = (undefined8 *)__cxa_allocate_exception(8);
        local_81 = 1;
        *local_80 = "cannot use the dummy null_vertex() as a real vertex";
        __cxa_throw(local_80,&char_const*::typeinfo,0);
      }
      puVar6 = (uint *)__gnu_cxx::
                       __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                       operator*(&local_48);
      insert_node_<true,false,true,double_const&>
                ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_98,(Siblings *)simplex,
                 res_insert._8_4_,(double *)(ulong)*puVar6);
      std::
      pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool>
      ::operator=((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool>
                   *)&vi,(type)local_98);
      if (((byte)res_insert.first.m_ptr & 1) != 0) {
        tVar7 = boost::size<std::vector<int,std::allocator<int>>>
                          ((vector<int,_std::allocator<int>_> *)filtration);
        iVar3 = (int)tVar7 + -1;
        if (*(int *)&simplex[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish < iVar3) {
          *(int *)&simplex[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = iVar3;
        }
      }
      std::
      pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
      ::
      pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool,_true>
                ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
                  *)this,(pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool>
                          *)&vi);
      pVar8._8_8_ = extraout_RDX;
      pVar8.first.m_ptr =
           (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
            *)this;
      return pVar8;
    }
    piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_48);
    iVar3 = *piVar5;
    VVar2 = null_vertex((Simplex_tree<Gudhi::Simplex_tree_options_default> *)simplex);
    local_78[0x17] = 0;
    if (iVar3 == VVar2) break;
    puVar6 = (uint *)__gnu_cxx::
                     __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_48);
    insert_node_<false,true,false,double_const&>
              ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_78,(Siblings *)simplex,
               res_insert._8_4_,(double *)(ulong)*puVar6);
    std::
    pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool>
    ::operator=((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool>
                 *)&vi,(type)local_78);
    ppVar4 = boost::container::
             vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
             ::operator->((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
                           *)&vi);
    res_insert._8_8_ =
         Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
         ::children(&ppVar4->second);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_48);
  }
  local_78._24_8_ = __cxa_allocate_exception(8);
  local_78[0x17] = 1;
  *(char **)local_78._24_8_ = "cannot use the dummy null_vertex() as a real vertex";
  __cxa_throw(local_78._24_8_,&char_const*::typeinfo,0);
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_raw(const RandomVertexHandleRange& simplex,
                                                     const Filtration_value& filtration) {
    Siblings * curr_sib = &root_;
    std::pair<Dictionary_it, bool> res_insert;
    auto vi = simplex.begin();

    for (; vi != std::prev(simplex.end()); ++vi) {
      GUDHI_CHECK(*vi != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
      res_insert = insert_node_<false, true, false>(curr_sib, *vi, filtration);
      curr_sib = res_insert.first->second.children();
    }

    GUDHI_CHECK(*vi != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    res_insert = insert_node_<true, false, true>(curr_sib, *vi, filtration);
    if (res_insert.second){
      int dim = static_cast<int>(boost::size(simplex)) - 1;
      if (dim > dimension_) {
        // Update dimension if needed
        dimension_ = dim;
      }
    }
    return res_insert;
  }